

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_OpenHttpGetEx(char *url_str,void **Handle,char **contentType,int *contentLength,
                      int *httpStatus,int lowRange,int highRange,int timeout)

{
  uint uVar1;
  int iVar2;
  http_header_t *phVar3;
  undefined1 local_328 [4];
  int rc;
  SendInstruction rangeBuf;
  int errCode;
  parse_status_t status;
  uri_type url;
  http_connection_handle_t *handle;
  membuffer request;
  size_t sockaddr_len;
  undefined1 auStack_48 [4];
  SOCKET tcp_connection;
  memptr ctype;
  int http_error_code;
  int lowRange_local;
  int *httpStatus_local;
  int *contentLength_local;
  char **contentType_local;
  void **Handle_local;
  char *url_str_local;
  
  url.hostport.IPaddress.__ss_align = 0;
  rangeBuf.RequestCookie._0_4_ = 0;
  ctype.length._4_4_ = lowRange;
  membuffer_init((membuffer *)&handle);
  if ((((url_str == (char *)0x0) || (Handle == (void **)0x0)) || (contentType == (char **)0x0)) ||
     (httpStatus == (int *)0x0)) {
    rangeBuf.RequestCookie._0_4_ = -0x65;
  }
  else {
    *httpStatus = 0;
    *Handle = (void *)url.hostport.IPaddress.__ss_align;
    *contentType = (char *)0x0;
    *contentLength = 0;
    if (highRange < (int)ctype.length._4_4_) {
      rangeBuf.RequestCookie._0_4_ = -0x38f;
    }
    else {
      memset(local_328,0,0x1d0);
      uVar1 = snprintf((char *)&rangeBuf.IsRangeActive,200,"Range: bytes=%d-%d\r\n",
                       (ulong)ctype.length._4_4_,(ulong)(uint)highRange);
      if ((-1 < (int)uVar1) && (uVar1 < 200)) {
        membuffer_init((membuffer *)&handle);
        rangeBuf.RequestCookie._0_4_ =
             MakeGetMessageEx(url_str,(membuffer *)&handle,(uri_type *)&errCode,
                              (SendInstruction *)local_328);
        if ((int)rangeBuf.RequestCookie == 0) {
          url.hostport.IPaddress.__ss_align = (unsigned_long)malloc(0x288);
          if ((void *)url.hostport.IPaddress.__ss_align == (void *)0x0) {
            rangeBuf.RequestCookie._0_4_ = -0x68;
          }
          else {
            memset((void *)url.hostport.IPaddress.__ss_align,0,0x288);
            parser_response_init
                      ((http_parser_t *)(url.hostport.IPaddress.__ss_align + 0x90),HTTPMETHOD_GET);
            iVar2 = socket((uint)(ushort)url.hostport.text.size,1,0);
            if (iVar2 == -1) {
              rangeBuf.RequestCookie._0_4_ = -0xd0;
              free((void *)url.hostport.IPaddress.__ss_align);
            }
            else {
              iVar2 = sock_init((SOCKINFO *)url.hostport.IPaddress.__ss_align,iVar2);
              if (iVar2 == 0) {
                request.size_inc = 0x10;
                if ((ushort)url.hostport.text.size == 10) {
                  request.size_inc = 0x1c;
                }
                rangeBuf.RequestCookie._0_4_ =
                     private_connect(*(SOCKET *)url.hostport.IPaddress.__ss_align,
                                     (sockaddr *)&url.hostport.text.size,(socklen_t)request.size_inc
                                    );
                if ((int)rangeBuf.RequestCookie == -1) {
                  sock_destroy((SOCKINFO *)url.hostport.IPaddress.__ss_align,2);
                  rangeBuf.RequestCookie._0_4_ = -0xcc;
                  free((void *)url.hostport.IPaddress.__ss_align);
                }
                else {
                  rangeBuf.RequestCookie._0_4_ =
                       http_SendMessage((SOCKINFO *)url.hostport.IPaddress.__ss_align,&timeout,"b",
                                        handle,request.buf);
                  if ((int)rangeBuf.RequestCookie == 0) {
                    iVar2 = ReadResponseLineAndHeaders
                                      ((SOCKINFO *)url.hostport.IPaddress.__ss_align,
                                       (http_parser_t *)(url.hostport.IPaddress.__ss_align + 0x90),
                                       &timeout,(int *)&ctype.length);
                    if (iVar2 == 4) {
                      rangeBuf.RequestCookie._4_4_ =
                           parser_get_entity_read_method
                                     ((http_parser_t *)(url.hostport.IPaddress.__ss_align + 0x90));
                      if ((rangeBuf.RequestCookie._4_4_ == PARSE_CONTINUE_1) ||
                         (rangeBuf.RequestCookie._4_4_ == PARSE_SUCCESS)) {
                        *httpStatus = *(int *)(url.hostport.IPaddress.__ss_align + 0x16c);
                        rangeBuf.RequestCookie._0_4_ = 0;
                        phVar3 = httpmsg_find_hdr((http_message_t *)
                                                  (url.hostport.IPaddress.__ss_align + 0x90),4,
                                                  (memptr *)auStack_48);
                        if (phVar3 == (http_header_t *)0x0) {
                          *contentType = (char *)0x0;
                        }
                        else {
                          *contentType = _auStack_48;
                        }
                        if (*(int *)(url.hostport.IPaddress.__ss_align + 0x248) == 4) {
                          *contentLength = 0;
                        }
                        else if (*(int *)(url.hostport.IPaddress.__ss_align + 0x24c) == 3) {
                          *contentLength = -3;
                        }
                        else if (*(int *)(url.hostport.IPaddress.__ss_align + 0x24c) == 2) {
                          *contentLength = *(int *)(url.hostport.IPaddress.__ss_align + 0x250);
                        }
                        else if (*(int *)(url.hostport.IPaddress.__ss_align + 0x24c) == 4) {
                          *contentLength = -4;
                        }
                        *Handle = (void *)url.hostport.IPaddress.__ss_align;
                      }
                      else {
                        rangeBuf.RequestCookie._0_4_ = -0x71;
                        free((void *)url.hostport.IPaddress.__ss_align);
                      }
                    }
                    else {
                      rangeBuf.RequestCookie._0_4_ = -0x71;
                      free((void *)url.hostport.IPaddress.__ss_align);
                    }
                  }
                  else {
                    sock_destroy((SOCKINFO *)url.hostport.IPaddress.__ss_align,2);
                    free((void *)url.hostport.IPaddress.__ss_align);
                  }
                }
              }
              else {
                sock_destroy((SOCKINFO *)url.hostport.IPaddress.__ss_align,2);
                rangeBuf.RequestCookie._0_4_ = -0xd0;
                free((void *)url.hostport.IPaddress.__ss_align);
              }
            }
          }
        }
      }
    }
  }
  membuffer_destroy((membuffer *)&handle);
  return (int)rangeBuf.RequestCookie;
}

Assistant:

int http_OpenHttpGetEx(const char *url_str,
	void **Handle,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int lowRange,
	int highRange,
	int timeout)
{
	int http_error_code;
	memptr ctype;
	SOCKET tcp_connection;
	size_t sockaddr_len;
	membuffer request;
	http_connection_handle_t *handle = NULL;
	uri_type url;
	parse_status_t status;
	int errCode = UPNP_E_SUCCESS;
	/* char rangeBuf[SIZE_RANGE_BUFFER]; */
	struct SendInstruction rangeBuf;
	int rc = 0;

	membuffer_init(&request);

	do {
		/* Checking Input parameters */
		if (!url_str || !Handle || !contentType || !httpStatus) {
			errCode = UPNP_E_INVALID_PARAM;
			break;
		}
		/* Initialize output parameters */
		*httpStatus = 0;
		*Handle = handle;
		*contentType = NULL;
		*contentLength = 0;
		if (lowRange > highRange) {
			errCode = UPNP_E_INTERNAL_ERROR;
			break;
		}
		memset(&rangeBuf, 0, sizeof(rangeBuf));
		rc = snprintf(rangeBuf.RangeHeader,
			sizeof(rangeBuf.RangeHeader),
			"Range: bytes=%d-%d\r\n",
			lowRange,
			highRange);
		if (rc < 0 || (unsigned int)rc >= sizeof(rangeBuf.RangeHeader))
			break;
		membuffer_init(&request);
		errCode = MakeGetMessageEx(url_str, &request, &url, &rangeBuf);
		if (errCode != UPNP_E_SUCCESS)
			break;
		handle = (http_connection_handle_t *)malloc(
			sizeof(http_connection_handle_t));
		if (!handle) {
			errCode = UPNP_E_OUTOF_MEMORY;
			break;
		}
		memset(handle, 0, sizeof(*handle));
		parser_response_init(&handle->response, HTTPMETHOD_GET);
		tcp_connection = socket(
			(int)url.hostport.IPaddress.ss_family, SOCK_STREAM, 0);
		if (tcp_connection == INVALID_SOCKET) {
			errCode = UPNP_E_SOCKET_ERROR;
			free(handle);
			break;
		}
		if (sock_init(&handle->sock_info, tcp_connection) !=
			UPNP_E_SUCCESS) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			errCode = UPNP_E_SOCKET_ERROR;
			free(handle);
			break;
		}
		sockaddr_len = url.hostport.IPaddress.ss_family == AF_INET6
				       ? sizeof(struct sockaddr_in6)
				       : sizeof(struct sockaddr_in);
		errCode = private_connect(handle->sock_info.socket,
			(struct sockaddr *)&(url.hostport.IPaddress),
			(socklen_t)sockaddr_len);
		if (errCode == -1) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			errCode = UPNP_E_SOCKET_CONNECT;
			free(handle);
			break;
		}
		/* send request */
		errCode = http_SendMessage(&handle->sock_info,
			&timeout,
			"b",
			request.buf,
			request.length);
		if (errCode != UPNP_E_SUCCESS) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			free(handle);
			break;
		}
		if (ReadResponseLineAndHeaders(&handle->sock_info,
			    &handle->response,
			    &timeout,
			    &http_error_code) != (int)PARSE_OK) {
			errCode = UPNP_E_BAD_RESPONSE;
			free(handle);
			break;
		}
		status = parser_get_entity_read_method(&handle->response);
		if (status != (parse_status_t)PARSE_CONTINUE_1 &&
			status != (parse_status_t)PARSE_SUCCESS) {
			errCode = UPNP_E_BAD_RESPONSE;
			free(handle);
			break;
		}
		*httpStatus = handle->response.msg.status_code;
		errCode = UPNP_E_SUCCESS;

		if (!httpmsg_find_hdr(
			    &handle->response.msg, HDR_CONTENT_TYPE, &ctype))
			/* no content-type */
			*contentType = NULL;
		else
			*contentType = ctype.buf;
		if (handle->response.position == (parser_pos_t)POS_COMPLETE)
			*contentLength = 0;
		else if (handle->response.ent_position == ENTREAD_USING_CHUNKED)
			*contentLength = UPNP_USING_CHUNKED;
		else if (handle->response.ent_position == ENTREAD_USING_CLEN)
			*contentLength = (int)handle->response.content_length;
		else if (handle->response.ent_position == ENTREAD_UNTIL_CLOSE)
			*contentLength = UPNP_UNTIL_CLOSE;
		*Handle = handle;
	} while (0);

	membuffer_destroy(&request);

	return errCode;
}